

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall
despot::Function::SetValue
          (Function *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,int key_pos,int pid,int cid,vector<double,_std::allocator<double>_> *values,
          int start,int end)

{
  pointer ppNVar1;
  pointer pvVar2;
  pointer pbVar3;
  NamedVar *this_00;
  pointer pcVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  NamedVar **ppNVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  ostream *poVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_double>_>,_std::_Rb_tree_iterator<std::pair<const_int,_double>_>_>
  pVar19;
  int cid_local;
  int local_6c;
  vector<double,_std::allocator<double>_> *local_68;
  Function *local_60;
  int local_54;
  string local_50;
  
  lVar15 = (long)key_pos;
  ppNVar1 = (this->parents_).
            super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  cid_local = cid;
  local_6c = key_pos;
  local_68 = values;
  if (((long)(this->parents_).
             super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) + 1 == lVar15) {
    if (end + -1 != start) {
      __assert_fail("start == end - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/parser/function.cpp"
                    ,0x26,
                    "bool despot::Function::SetValue(vector<string> &, int, int, int, const vector<double> &, int, int)"
                   );
    }
    pvVar2 = (this->values_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (vector<double,_std::allocator<double>_> *)
               (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[start];
    if ((this->values_).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pvVar2) {
      this_01 = &(this->map_).
                 super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[pid]._M_t;
      if (((double)local_68 != 0.0) || (NAN((double)local_68))) {
        pmVar10 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                              *)this_01,&cid_local);
        *pmVar10 = (mapped_type)local_68;
      }
      else {
        local_68 = values;
        pVar19 = std::
                 _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 ::equal_range(this_01,&cid_local);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::_M_erase_aux(this_01,(_Base_ptr)pVar19.first._M_node,(_Base_ptr)pVar19.second._M_node);
      }
    }
    else {
      pvVar2[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[cid] = (double)local_68;
    }
    bVar7 = true;
  }
  else {
    pbVar3 = (keys->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppNVar9 = ppNVar1 + lVar15;
    if (((long)(keys->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) + -1 == lVar15) {
      ppNVar9 = &this->child_;
    }
    this_00 = *ppNVar9;
    local_60 = this;
    iVar8 = std::__cxx11::string::compare((char *)(pbVar3 + lVar15));
    if (iVar8 == 0) {
      lVar14 = (long)(this_00->super_Variable).values_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->super_Variable).values_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      bVar7 = lVar14 == 0;
      if (!bVar7) {
        uVar18 = lVar14 >> 5;
        local_6c = local_6c + 1;
        uVar11 = 0;
        do {
          iVar13 = (int)uVar11;
          iVar8 = pid;
          if (((long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) + -1 != lVar15) {
            iVar8 = (int)uVar18 * pid + iVar13;
            iVar13 = cid_local;
          }
          bVar6 = SetValue(local_60,keys,local_6c,iVar8,iVar13,local_68,start,end);
          if (!bVar6) {
            return bVar7;
          }
          uVar11 = uVar11 + 1;
          uVar18 = (long)(this_00->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          bVar7 = uVar18 <= uVar11;
        } while (uVar11 < uVar18);
      }
    }
    else {
      iVar8 = std::__cxx11::string::compare
                        ((char *)((keys->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar15));
      if (iVar8 == 0) {
        pbVar3 = (this_00->super_Variable).values_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar5 = (this_00->super_Variable).values_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = 0;
        local_6c = local_6c + 1;
        do {
          uVar11 = (long)(this_00->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (uVar11 <= uVar18) {
            return uVar11 <= uVar18;
          }
          iVar17 = (int)uVar18;
          iVar8 = pid;
          iVar13 = iVar17;
          if (((long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) + -1 != lVar15) {
            iVar8 = (int)uVar11 * pid + iVar17;
            iVar13 = cid_local;
          }
          iVar16 = (int)((ulong)(long)(end - start) / (ulong)((long)pbVar3 - (long)pbVar5 >> 5));
          uVar18 = uVar18 + 1;
          bVar7 = SetValue(local_60,keys,local_6c,iVar8,iVar13,local_68,iVar17 * iVar16 + start,
                           (int)uVar18 * iVar16 + start);
        } while (bVar7);
      }
      else {
        pbVar3 = (keys->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar4 = pbVar3[lVar15]._M_dataplus._M_p;
        local_54 = pid;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + pbVar3[lVar15]._M_string_length);
        iVar8 = Variable::IndexOf(&this_00->super_Variable,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (-1 < iVar8) {
          iVar13 = local_54;
          if (((long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) + -1 != lVar15) {
            iVar13 = (int)((ulong)((long)(this_00->super_Variable).values_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->super_Variable).values_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5) * local_54
                     + iVar8;
            iVar8 = cid_local;
          }
          cid_local = iVar8;
          bVar7 = SetValue(local_60,keys,local_6c + 1,iVar13,cid_local,local_68,start,end);
          return bVar7;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
        pbVar3 = (keys->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pbVar3[lVar15]._M_dataplus._M_p,
                             pbVar3[lVar15]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," is not in the domain of ",0x19)
        ;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(this_00->name_)._M_dataplus._M_p,
                             (this_00->name_)._M_string_length);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
      }
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool Function::SetValue(vector<string>& keys, int key_pos, int pid, int cid,
	const vector<double>& values, int start, int end) {
	if (key_pos == parents_.size() + 1) {
		assert(start == end - 1);

		if (values_.size() > 0) // TODO: possible refactoring to use a single data structure
			values_[pid][cid] = values[start];
		else {
			if (values[start] != 0.0) {
				map_[pid][cid] = values[start];
			} else {
				map_[pid].erase(cid);
			}
		}

		return true;
	} else {
		NamedVar* curr =
			(key_pos == keys.size() - 1) ? child_ : parents_[key_pos];
		const vector<string>& dom = curr->values();

		if (keys[key_pos] == "*") {
			for (int i = 0; i < dom.size(); i++) {
				int next_cid = cid, next_pid = pid;
				if (key_pos == keys.size() - 1)
					next_cid = i;
				else
					next_pid = pid * dom.size() + i;

				if (!SetValue(keys, key_pos + 1, next_pid, next_cid, values,
					start, end))
					return false;
			}
			return true;
		} else if (keys[key_pos] == "-") {
			int block_size = (end - start) / curr->values().size();

			for (int i = 0; i < dom.size(); i++) {
				int next_cid = cid, next_pid = pid;
				if (key_pos == keys.size() - 1)
					next_cid = i;
				else
					next_pid = pid * dom.size() + i;

				if (!SetValue(keys, key_pos + 1, next_pid, next_cid, values,
					start + i * block_size, start + (i + 1) * block_size))
					return false;
			}
			return true;
		} else {
			int id = curr->IndexOf(keys[key_pos]);
			if (id < 0) {
				cerr << "ERROR: " << keys[key_pos]
					<< " is not in the domain of " << curr->name() << endl;
				return false;
			}

			if (key_pos == keys.size() - 1)
				cid = id;
			else
				pid = pid * dom.size() + id;

			return SetValue(keys, key_pos + 1, pid, cid, values, start, end);
		}
	}
}